

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxUniformComponentsTest::GeometryShaderMaxUniformComponentsTest
          (GeometryShaderMaxUniformComponentsTest *this,Context *context,ExtParameters *extParams,
          char *name,char *description)

{
  char *description_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  GeometryShaderMaxUniformComponentsTest *this_local;
  
  GeometryShaderLimitsTransformFeedbackBase::GeometryShaderLimitsTransformFeedbackBase
            (&this->super_GeometryShaderLimitsTransformFeedbackBase,context,extParams,name,
             description);
  (this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.super_TestCase.
  super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderMaxUniformComponentsTest_0326f9a8;
  std::__cxx11::string::string((string *)&this->m_max_uniform_vectors_string);
  this->m_max_uniform_components = 0;
  this->m_max_uniform_vectors = 0;
  this->m_uniform_location = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_uniform_data);
  return;
}

Assistant:

GeometryShaderMaxUniformComponentsTest::GeometryShaderMaxUniformComponentsTest(Context&				context,
																			   const ExtParameters& extParams,
																			   const char*			name,
																			   const char*			description)
	: GeometryShaderLimitsTransformFeedbackBase(context, extParams, name, description)
	, m_max_uniform_components(0)
	, m_max_uniform_vectors(0)
	, m_uniform_location(0)
{
	/* Nothing to be done here */
}